

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::Session::~Session(Session *this)

{
  Session *this_local;
  
  (this->super_NonCopyable)._vptr_NonCopyable = (_func_int **)&PTR__Session_003d8500;
  cleanUp();
  clara::std::shared_ptr<Catch::Config>::~shared_ptr(&this->m_config);
  ConfigData::~ConfigData(&this->m_configData);
  clara::detail::Parser::~Parser(&this->m_cli);
  NonCopyable::~NonCopyable(&this->super_NonCopyable);
  return;
}

Assistant:

Session::~Session() {
        Catch::cleanUp();
    }